

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib558.c
# Opt level: O0

int test(char *URL)

{
  int iVar1;
  void *__ptr;
  long lVar2;
  int asize;
  char *ptr;
  CURLcode res;
  undefined8 uStack_26;
  uchar a [14];
  char *URL_local;
  
  uStack_26 = 0x913f3e3d3c3b3a2f;
  a[0] = 0xa2;
  a[1] = 0xb3;
  a[2] = 0xc4;
  a[3] = 0xd5;
  a[4] = 0xe6;
  a[5] = 0xf7;
  a._6_8_ = URL;
  iVar1 = curl_global_init(3);
  if (iVar1 == 0) {
    __ptr = malloc(0x22e);
    free(__ptr);
    lVar2 = curl_easy_escape(0,&stack0xffffffffffffffda,0xe);
    if (lVar2 != 0) {
      curl_free(lVar2);
    }
    curl_global_cleanup();
    URL_local._4_4_ = 0;
  }
  else {
    curl_mfprintf(_stderr,"curl_global_init() failed\n");
    URL_local._4_4_ = 0x7e;
  }
  return URL_local._4_4_;
}

Assistant:

int test(char *URL)
{
  unsigned char a[] = {0x2f, 0x3a, 0x3b, 0x3c, 0x3d, 0x3e, 0x3f,
                       0x91, 0xa2, 0xb3, 0xc4, 0xd5, 0xe6, 0xf7};
  CURLcode res = CURLE_OK;
  char *ptr = NULL;
  int asize;

  (void)URL; /* we don't use this */

  if(curl_global_init(CURL_GLOBAL_ALL) != CURLE_OK) {
    fprintf(stderr, "curl_global_init() failed\n");
    return TEST_ERR_MAJOR_BAD;
  }

  ptr = malloc(558);
  Curl_safefree(ptr);

  asize = (int)sizeof(a);
  ptr = curl_easy_escape(NULL, (char *)a, asize);
  if(ptr)
    curl_free(ptr);

  curl_global_cleanup();

  return (int)res;
}